

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_SaveSurface(SDL_Surface *surface,char *filename,GPU_FileFormatEnum format)

{
  byte *pbVar1;
  byte *pbVar2;
  void *data;
  long lVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  
  if (((filename == (char *)0x0 || surface == (SDL_Surface *)0x0) || (surface->w < 1)) ||
     (surface->h < 1)) {
LAB_001376eb:
    bVar8 = false;
  }
  else {
    data = surface->pixels;
    if (format == GPU_FILE_AUTO) {
      pcVar5 = strrchr(filename,0x2e);
      pcVar6 = pcVar5 + 1;
      if (pcVar5 == filename) {
        pcVar6 = "";
      }
      if (pcVar5 == (char *)0x0) {
        pcVar6 = "";
      }
      lVar7 = 0;
      do {
        pbVar1 = (byte *)(pcVar6 + lVar7);
        lVar3 = lVar7 + 0x19;
        if ((ulong)*pbVar1 == 0) break;
        lVar7 = lVar7 + 1;
      } while (""[*pbVar1] == ""[(byte)"data/tutorial-space/ship.png"[lVar3]]);
      bVar8 = true;
      format = GPU_FILE_PNG;
      if (""[*pbVar1] != ""[(byte)"data/tutorial-space/ship.png"[lVar3]]) {
        lVar7 = 0;
        do {
          pbVar1 = (byte *)(pcVar6 + lVar7);
          pbVar2 = (byte *)("bmp" + lVar7);
          if ((ulong)*pbVar1 == 0) break;
          lVar7 = lVar7 + 1;
        } while (""[*pbVar1] == ""[*pbVar2]);
        format = GPU_FILE_BMP;
        if (""[*pbVar1] != ""[*pbVar2]) {
          lVar7 = 0;
          do {
            pbVar1 = (byte *)(pcVar6 + lVar7);
            pbVar2 = (byte *)("tga" + lVar7);
            if ((ulong)*pbVar1 == 0) break;
            lVar7 = lVar7 + 1;
          } while (""[*pbVar1] == ""[*pbVar2]);
          format = GPU_FILE_TGA;
          if (""[*pbVar1] != ""[*pbVar2]) {
            format = GPU_FILE_AUTO;
            GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,
                              "Could not detect output file format from file name");
            bVar8 = false;
          }
        }
      }
      if (!bVar8) goto LAB_001376eb;
    }
    if (format == GPU_FILE_TGA) {
      iVar4 = stbi_write_tga(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data);
    }
    else if (format == GPU_FILE_BMP) {
      iVar4 = stbi_write_bmp(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data);
    }
    else {
      if (format != GPU_FILE_PNG) {
        GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,"Unsupported output file format");
        return false;
      }
      iVar4 = stbi_write_png(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data,0);
    }
    bVar8 = 0 < iVar4;
  }
  return bVar8;
}

Assistant:

GPU_bool GPU_SaveSurface(SDL_Surface* surface, const char* filename, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || filename == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }


    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        const char* extension = get_filename_ext(filename);
        if(gpu_strcasecmp(extension, "png") == 0)
            format = GPU_FILE_PNG;
        else if(gpu_strcasecmp(extension, "bmp") == 0)
            format = GPU_FILE_BMP;
        else if(gpu_strcasecmp(extension, "tga") == 0)
            format = GPU_FILE_TGA;
        else
        {
            GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Could not detect output file format from file name");
            return GPU_FALSE;
        }
    }

    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png(filename, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, 0) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    return result;
}